

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O1

void Bac_PtrDumpBoxBlif(FILE *pFile,Vec_Ptr_t *vBox)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  fwrite(".subckt",7,1,(FILE *)pFile);
  if (0 < vBox->nSize) {
    fprintf((FILE *)pFile," %s",*vBox->pArray);
    iVar2 = vBox->nSize;
    if (2 < iVar2) {
      lVar3 = 3;
      do {
        if (iVar2 <= lVar3) goto LAB_003b9718;
        fprintf((FILE *)pFile," %s=%s",vBox->pArray[lVar3 + -1],vBox->pArray[lVar3]);
        iVar2 = vBox->nSize;
        iVar1 = (int)lVar3;
        lVar3 = lVar3 + 2;
      } while (iVar1 + 1 < iVar2);
    }
    fputc(10,(FILE *)pFile);
    return;
  }
LAB_003b9718:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Bac_PtrDumpBoxBlif( FILE * pFile, Vec_Ptr_t * vBox )
{
    char * pName; int i;
    fprintf( pFile, ".subckt" );
    fprintf( pFile, " %s", (char *)Vec_PtrEntry(vBox, 0) );
    //fprintf( pFile, " %s", (char *)Vec_PtrEntry(vBox, 1) ); // do not write intance name in BLIF
    Vec_PtrForEachEntryStart( char *, vBox, pName, i, 2 )
        fprintf( pFile, " %s=%s", pName, (char *)Vec_PtrEntry(vBox, i+1) ), i++;
    fprintf( pFile, "\n" );
}